

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

spv_result_t spvtools::val::CfgPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  spv_result_t sVar4;
  Function *pFVar5;
  BasicBlock *pBVar6;
  Instruction *pIVar7;
  char *pcVar8;
  ExecutionModel model;
  char *pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [8];
  size_t index;
  uint32_t target;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cases;
  uint local_28c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_220;
  undefined1 local_208 [8];
  uint *puStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [28];
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0xf6:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    sVar4 = MergeBlockAssert(_,uVar2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    pFVar5 = ValidationState_t::current_function(_);
    sVar4 = Function::RegisterLoopMerge(pFVar5,uVar2,uVar3);
    goto LAB_002be116;
  case 0xf7:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    sVar4 = MergeBlockAssert(_,uVar2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    pFVar5 = ValidationState_t::current_function(_);
    sVar4 = Function::RegisterSelectionMerge(pFVar5,uVar2);
LAB_002be116:
    if (sVar4 == SPV_SUCCESS) {
      return SPV_SUCCESS;
    }
    return sVar4;
  case 0xf8:
    pFVar5 = ValidationState_t::current_function(_);
    sVar4 = Function::RegisterBlock(pFVar5,(inst->inst_).result_id,true);
    if (sVar4 == SPV_SUCCESS) {
      pFVar5 = ValidationState_t::current_function(_);
      pBVar6 = Function::current_block(pFVar5);
      pBVar6->label_ = inst;
      return SPV_SUCCESS;
    }
    return sVar4;
  case 0xf9:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    sVar4 = FirstBlockAssert(_,uVar2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    pFVar5 = ValidationState_t::current_function(_);
    local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start + 4);
    *local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = uVar2;
    local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    Function::RegisterBlockEnd(pFVar5,&local_220);
    auVar12 = (undefined1  [8])
              local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar11 = local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    break;
  case 0xfa:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    sVar4 = FirstBlockAssert(_,uVar2);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    sVar4 = FirstBlockAssert(_,uVar3);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    pFVar5 = ValidationState_t::current_function(_);
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(8);
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start + 8);
    *(size_type *)
     local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = CONCAT44(uVar3,uVar2);
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    Function::RegisterBlockEnd(pFVar5,&local_238);
    auVar12 = (undefined1  [8])
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar11 = local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    break;
  case 0xfb:
    local_208 = (undefined1  [8])0x0;
    puStack_200 = (uint *)0x0;
    local_1f8[0]._M_allocated_capacity = (uint *)0x0;
    if (0x10 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      index = 1;
      do {
        local_28c = Instruction::GetOperandAs<unsigned_int>(inst,index);
        sVar4 = FirstBlockAssert(_,local_28c);
        if (sVar4 != SPV_SUCCESS) {
          if (local_208 != (undefined1  [8])0x0) {
            operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity - (long)local_208);
            return sVar4;
          }
          return sVar4;
        }
        if (puStack_200 == (uint *)local_1f8[0]._0_8_) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_208,
                     (iterator)puStack_200,&local_28c);
        }
        else {
          *puStack_200 = local_28c;
          puStack_200 = puStack_200 + 1;
        }
        index = index + 2;
      } while (index < (ulong)((long)(inst->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(inst->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    pFVar5 = ValidationState_t::current_function(_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_250,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
    Function::RegisterBlockEnd(pFVar5,&local_250);
    auVar12 = local_208;
    uVar11 = local_1f8[0]._M_allocated_capacity;
    if (local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      auVar12 = local_208;
      uVar11 = local_1f8[0]._M_allocated_capacity;
    }
    goto joined_r0x002be0d4;
  case 0xfd:
    pFVar5 = ValidationState_t::current_function(_);
    pIVar7 = ValidationState_t::FindDef(_,pFVar5->result_type_id_);
    if (pIVar7 == (Instruction *)0x0) {
      __assert_fail("return_type_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_cfg.cpp"
                    ,0x485,
                    "spv_result_t spvtools::val::CfgPass(ValidationState_t &, const Instruction *)")
      ;
    }
    if ((pIVar7->inst_).opcode != 0x13) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_CFG,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpReturn can only be called from a function with void ",0x36)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"return type.",0xc);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return local_38;
    }
    pFVar5 = ValidationState_t::current_function(_);
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    Function::RegisterBlockEnd(pFVar5,&local_268);
    auVar12 = (undefined1  [8])
              local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar11 = local_268.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
joined_r0x002be0d4:
    if (auVar12 == (undefined1  [8])0x0) {
      return SPV_SUCCESS;
    }
    goto LAB_002be37e;
  default:
    if (((0x21 < uVar1 - 0x1140) || ((0x300000001U >> ((ulong)(uVar1 - 0x1140) & 0x3f) & 1) == 0))
       && (uVar1 != 0x14ae)) {
      return SPV_SUCCESS;
    }
  case 0xfc:
  case 0xfe:
  case 0xff:
    pFVar5 = ValidationState_t::current_function(_);
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Function::RegisterBlockEnd(pFVar5,&local_288);
    if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_288.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (uVar1 < 0x1160) {
      if (uVar1 == 0xfc) {
        pFVar5 = ValidationState_t::current_function(_);
        pcVar9 = "OpKill requires Fragment execution model";
        pcVar8 = "";
      }
      else {
        if (uVar1 != 0x1140) {
          return SPV_SUCCESS;
        }
        pFVar5 = ValidationState_t::current_function(_);
        pcVar9 = "OpTerminateInvocation requires Fragment execution model";
        pcVar8 = "";
      }
      local_208 = (undefined1  [8])local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,pcVar9,pcVar8);
      model = Fragment;
    }
    else {
      if (uVar1 == 0x1160) {
        pFVar5 = ValidationState_t::current_function(_);
        pcVar9 = "OpIgnoreIntersectionKHR requires AnyHitKHR execution model";
        pcVar8 = "";
      }
      else {
        if (uVar1 != 0x1161) {
          return SPV_SUCCESS;
        }
        pFVar5 = ValidationState_t::current_function(_);
        pcVar9 = "OpTerminateRayKHR requires AnyHitKHR execution model";
        pcVar8 = "";
      }
      local_208 = (undefined1  [8])local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,pcVar9,pcVar8);
      model = AnyHitKHR;
    }
    Function::RegisterExecutionModelLimitation(pFVar5,model,(string *)local_208);
    if (local_208 == (undefined1  [8])local_1f8) {
      return SPV_SUCCESS;
    }
    uVar10 = local_1f8[0]._M_allocated_capacity + 1;
    auVar12 = local_208;
    goto LAB_002be381;
  }
  if (auVar12 == (undefined1  [8])0x0) {
    return SPV_SUCCESS;
  }
LAB_002be37e:
  uVar10 = uVar11 - (long)auVar12;
LAB_002be381:
  operator_delete((void *)auVar12,uVar10);
  return SPV_SUCCESS;
}

Assistant:

spv_result_t CfgPass(ValidationState_t& _, const Instruction* inst) {
  spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpLabel:
      if (auto error = _.current_function().RegisterBlock(inst->id()))
        return error;

      // TODO(github:1661) This should be done in the
      // ValidationState::RegisterInstruction method but because of the order of
      // passes the OpLabel ends up not being part of the basic block it starts.
      _.current_function().current_block()->set_label(inst);
      break;
    case spv::Op::OpLoopMerge: {
      uint32_t merge_block = inst->GetOperandAs<uint32_t>(0);
      uint32_t continue_block = inst->GetOperandAs<uint32_t>(1);
      CFG_ASSERT(MergeBlockAssert, merge_block);

      if (auto error = _.current_function().RegisterLoopMerge(merge_block,
                                                              continue_block))
        return error;
    } break;
    case spv::Op::OpSelectionMerge: {
      uint32_t merge_block = inst->GetOperandAs<uint32_t>(0);
      CFG_ASSERT(MergeBlockAssert, merge_block);

      if (auto error = _.current_function().RegisterSelectionMerge(merge_block))
        return error;
    } break;
    case spv::Op::OpBranch: {
      uint32_t target = inst->GetOperandAs<uint32_t>(0);
      CFG_ASSERT(FirstBlockAssert, target);

      _.current_function().RegisterBlockEnd({target});
    } break;
    case spv::Op::OpBranchConditional: {
      uint32_t tlabel = inst->GetOperandAs<uint32_t>(1);
      uint32_t flabel = inst->GetOperandAs<uint32_t>(2);
      CFG_ASSERT(FirstBlockAssert, tlabel);
      CFG_ASSERT(FirstBlockAssert, flabel);

      _.current_function().RegisterBlockEnd({tlabel, flabel});
    } break;

    case spv::Op::OpSwitch: {
      std::vector<uint32_t> cases;
      for (size_t i = 1; i < inst->operands().size(); i += 2) {
        uint32_t target = inst->GetOperandAs<uint32_t>(i);
        CFG_ASSERT(FirstBlockAssert, target);
        cases.push_back(target);
      }
      _.current_function().RegisterBlockEnd({cases});
    } break;
    case spv::Op::OpReturn: {
      const uint32_t return_type = _.current_function().GetResultTypeId();
      const Instruction* return_type_inst = _.FindDef(return_type);
      assert(return_type_inst);
      if (return_type_inst->opcode() != spv::Op::OpTypeVoid)
        return _.diag(SPV_ERROR_INVALID_CFG, inst)
               << "OpReturn can only be called from a function with void "
               << "return type.";
      _.current_function().RegisterBlockEnd(std::vector<uint32_t>());
      break;
    }
    case spv::Op::OpKill:
    case spv::Op::OpReturnValue:
    case spv::Op::OpUnreachable:
    case spv::Op::OpTerminateInvocation:
    case spv::Op::OpIgnoreIntersectionKHR:
    case spv::Op::OpTerminateRayKHR:
    case spv::Op::OpEmitMeshTasksEXT:
      _.current_function().RegisterBlockEnd(std::vector<uint32_t>());
      // Ops with dedicated passes check for the Execution Model there
      if (opcode == spv::Op::OpKill) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::Fragment,
            "OpKill requires Fragment execution model");
      }
      if (opcode == spv::Op::OpTerminateInvocation) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::Fragment,
            "OpTerminateInvocation requires Fragment execution model");
      }
      if (opcode == spv::Op::OpIgnoreIntersectionKHR) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::AnyHitKHR,
            "OpIgnoreIntersectionKHR requires AnyHitKHR execution model");
      }
      if (opcode == spv::Op::OpTerminateRayKHR) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::AnyHitKHR,
            "OpTerminateRayKHR requires AnyHitKHR execution model");
      }

      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}